

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O1

ReadState __thiscall
CombinedH264Reader::detectStreamByNal(CombinedH264Reader *this,uint8_t *data,uint8_t *dataEnd)

{
  byte bVar1;
  int iVar2;
  ReadState RVar3;
  SEIUnit sei;
  undefined1 local_228 [72];
  __buckets_ptr pp_Stack_1e0;
  size_type local_1d8;
  __node_base local_1d0;
  size_type sStack_1c8;
  float local_1c0;
  undefined1 local_1b8 [8];
  __node_base_ptr local_1b0 [5];
  uint local_188;
  pointer local_a0;
  int local_98;
  uint8_t *local_90;
  
  bVar1 = *data & 0x1f;
  switch(bVar1) {
  case 6:
    pp_Stack_1e0 = local_1b0;
    local_228._32_4_ = 0;
    local_228._40_8_ = (uint *)0x0;
    local_228._48_8_ = (uint *)0x0;
    local_228._56_4_ = 0;
    local_228._60_4_ = 0;
    local_228._8_4_ = nuUnspecified;
    local_228._12_4_ = 0;
    local_228._16_8_ = (uint8_t *)0x0;
    local_228._24_4_ = 0;
    local_228._0_8_ = &PTR__SEIUnit_002404a0;
    local_228._64_8_ = local_228._64_8_ & 0xffffffffffffff00;
    local_1d8 = 1;
    local_1d0._M_nxt = (_Hash_node_base *)0x0;
    sStack_1c8 = 0;
    local_1c0 = 1.0;
    memset(local_1b8,0,0x118);
    local_a0 = (pointer)0xffffffff;
    local_98 = 0;
    local_90 = (uint8_t *)0x0;
    NALUnit::decodeBuffer((NALUnit *)local_228,data,dataEnd);
    iVar2 = SEIUnit::isMVCSEI((SEIUnit *)local_228);
    RVar3 = NeedMoreData;
    if (iVar2 != -10) {
      RVar3 = Secondary - (iVar2 == 0);
    }
    SEIUnit::~SEIUnit((SEIUnit *)local_228);
    break;
  case 8:
    local_228._32_4_ = 0;
    local_228._40_8_ = (uint *)0x0;
    local_228._48_8_ = (uint *)0x0;
    local_228._56_4_ = 0;
    local_228._60_4_ = 0;
    local_228._8_4_ = nuUnspecified;
    local_228._12_4_ = 0;
    local_228._16_8_ = (uint8_t *)0x0;
    local_228._24_4_ = 0;
    local_228._0_8_ = &PTR__NALUnit_00240450;
    local_228[0x40] = false;
    local_228[0x41] = 0;
    local_228._66_2_ = 0;
    local_228._68_2_ = 0;
    local_228._70_2_ = 0;
    pp_Stack_1e0 = (__buckets_ptr)0x100000001;
    local_1d8 = local_1d8 & 0xffffffffffffff00;
    NALUnit::decodeBuffer((NALUnit *)local_228,data,dataEnd);
    iVar2 = PPSUnit::deserialize((PPSUnit *)local_228);
    RVar3 = NeedMoreData;
    if (iVar2 != -10) {
      RVar3 = (local_228._68_4_ == this->m_mvcSPS) + Primary;
    }
    local_228._0_8_ = &PTR__NALUnit_00242058;
    if ((uint8_t *)local_228._16_8_ != (uint8_t *)0x0) {
      operator_delete__((void *)local_228._16_8_);
    }
    break;
  case 10:
    RVar3 = Both;
    break;
  case 0xf:
    SPSUnit::SPSUnit((SPSUnit *)local_228);
    NALUnit::decodeBuffer((NALUnit *)local_228,data,dataEnd);
    iVar2 = SPSUnit::deserialize((SPSUnit *)local_228);
    RVar3 = NeedMoreData;
    if (iVar2 != -10) {
      this->m_mvcSPS = local_188;
      RVar3 = Secondary;
    }
    SPSUnit::~SPSUnit((SPSUnit *)local_228);
    break;
  default:
    if ((bVar1 == 0x18) || (bVar1 == 0x14)) {
      return Secondary;
    }
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    RVar3 = Primary;
  }
  return RVar3;
}

Assistant:

CombinedH264Reader::ReadState CombinedH264Reader::detectStreamByNal(const uint8_t* data, const uint8_t* dataEnd)
{
    const auto nalType = static_cast<NALUnit::NALType>(*data & 0x1f);

    switch (nalType)
    {
    case NALUnit::NALType::nuEOSeq:
        return ReadState::Both;
    case NALUnit::NALType::nuDRD:
    case NALUnit::NALType::nuSliceExt:
        return ReadState::Secondary;

    case NALUnit::NALType::nuSubSPS:
    {
        SPSUnit sps;
        sps.decodeBuffer(data, dataEnd);
        if (sps.deserialize() == NOT_ENOUGH_BUFFER)
            return ReadState::NeedMoreData;
        m_mvcSPS = sps.seq_parameter_set_id;
        return ReadState::Secondary;
    }
    case NALUnit::NALType::nuPPS:
    {
        PPSUnit pps;
        pps.decodeBuffer(data, dataEnd);
        if (pps.deserialize() == NOT_ENOUGH_BUFFER)
            return ReadState::NeedMoreData;
        if (pps.seq_parameter_set_id == m_mvcSPS)
            return ReadState::Secondary;
        return ReadState::Primary;
    }
    case NALUnit::NALType::nuSEI:
    {
        SEIUnit sei;
        sei.decodeBuffer(data, dataEnd);
        const int rez = sei.isMVCSEI();
        if (rez == NOT_ENOUGH_BUFFER)
            return ReadState::NeedMoreData;
        if (rez == 0)
            return ReadState::Primary;
        return ReadState::Secondary;
    }
    default:
        return ReadState::Primary;
    }
}